

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coop.c
# Opt level: O3

void thread1(void)

{
  ulong uVar1;
  Sched *pSVar2;
  int iVar3;
  ulong uVar4;
  char str [64];
  char **local_80;
  char *local_78 [9];
  
  local_78[0] = "[Thread 1] started";
  fiber_exec_on(&the_thread->fiber,&(the_thread->sched->main_thread).fiber,run_put_str,local_78);
  pSVar2 = the_thread->sched;
  if (pSVar2->shutdown_signal == false) {
    iVar3 = -1;
    uVar4 = 1;
    uVar1 = 0;
    do {
      snprintf((char *)local_78,0x40,"[Thread 1] running: %d",uVar1);
      local_80 = local_78;
      fiber_exec_on(&the_thread->fiber,&(the_thread->sched->main_thread).fiber,run_put_str,&local_80
                   );
      if ((int)(uVar4 / 0x1e) * 0x20 + (int)(uVar4 / 0x1e) * -2 + iVar3 == 0) {
        message = MsgFork;
      }
      else if (iVar3 + (int)(uVar4 / 6) * 6 == 0) {
        message = MsgPing;
      }
      thread_switch(the_thread,the_thread->next);
      pSVar2 = the_thread->sched;
      iVar3 = iVar3 + -1;
      uVar4 = (ulong)((int)uVar4 + 1);
      uVar1 = (ulong)((int)uVar1 + 1);
    } while (pSVar2->shutdown_signal != true);
  }
  local_78[0] = "[Thread 1] exiting";
  fiber_exec_on(&the_thread->fiber,&(pSVar2->main_thread).fiber,run_put_str,local_78);
  return;
}

Assistant:

static void
thread1(void)
{
    put_str("[Thread 1] started");
    int tok = 0;
    while (!shutting_down()) {
        char str[64];
        snprintf(str, sizeof str, "[Thread 1] running: %d", tok++);
        put_str(str);
        if (tok % 30 == 0)
            message = MsgFork;
        else if (tok % 6 == 0)
            message = MsgPing;
        yield();
    }
    put_str("[Thread 1] exiting");
}